

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFileDB.cpp
# Opt level: O3

void __thiscall ObjectFileDB::process_labels(ObjectFileDB *this)

{
  pointer pbVar1;
  long lVar2;
  uint32_t uVar3;
  iterator iVar4;
  int64_t iVar5;
  uint uVar6;
  ObjectFileData *obj;
  long lVar7;
  pointer __k;
  Timer process_label_timer;
  Timer local_48;
  
  puts("- Processing Labels...");
  local_48._startTime.tv_sec = 0;
  local_48._startTime.tv_nsec = 0;
  Timer::start(&local_48);
  pbVar1 = (this->obj_file_order).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __k = (this->obj_file_order).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  if ((this->obj_files_by_name)._M_h._M_element_count == (long)pbVar1 - (long)__k >> 5) {
    uVar6 = 0;
    while( true ) {
      if (__k == pbVar1) {
        puts("Processed Labels:");
        printf(" total %d labels\n",(ulong)uVar6);
        iVar5 = Timer::getNs(&local_48);
        printf(" total %.3f ms\n",SUB84((double)iVar5 / 1000000.0,0));
        putchar(10);
        return;
      }
      iVar4 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)this,__k);
      if (iVar4.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_true>
          ._M_cur == (__node_type *)0x0) break;
      lVar2 = *(long *)((long)iVar4.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_true>
                              ._M_cur + 0x30);
      for (lVar7 = *(long *)((long)iVar4.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_true>
                                   ._M_cur + 0x28); lVar7 != lVar2; lVar7 = lVar7 + 0x120) {
        uVar3 = LinkedObjectFile::set_ordered_label_names((LinkedObjectFile *)(lVar7 + 0x18));
        uVar6 = uVar6 + uVar3;
      }
      __k = __k + 1;
    }
    std::__throw_out_of_range("_Map_base::at");
  }
  __assert_fail("obj_files_by_name.size() == obj_file_order.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.h"
                ,0x3e,
                "void ObjectFileDB::for_each_obj(Func) [Func = (lambda at /workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.cpp:257:16)]"
               );
}

Assistant:

void ObjectFileDB::process_labels() {
  printf("- Processing Labels...\n");
  Timer process_label_timer;
  uint32_t total = 0;
  for_each_obj([&](ObjectFileData& obj) { total += obj.linked_data.set_ordered_label_names(); });

  printf("Processed Labels:\n");
  printf(" total %d labels\n", total);
  printf(" total %.3f ms\n", process_label_timer.getMs());
  printf("\n");
}